

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O1

string * __thiscall
Node::OutputForcedType_abi_cxx11_(string *__return_storage_ptr__,Node *this,VARTYPE VarType)

{
  bool bVar1;
  VARTYPE VVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  VVar2 = GetNodeVarType(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Type == 0x203) {
    NoParen_abi_cxx11_(&local_d0,this);
  }
  else {
    bVar1 = VVar2 - VARTYPE_BYTE < 4;
    if (VarType != VARTYPE_INTEGER) {
      bVar1 = VVar2 == VarType;
    }
    if (!bVar1) {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"(","");
      OutputVarType_abi_cxx11_(&local_70,VarType);
      uVar7 = 0xf;
      if (local_50 != &local_40) {
        uVar7 = local_40._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_70._M_string_length + local_48) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          uVar7 = local_70.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_70._M_string_length + local_48) goto LAB_0011a977;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_0011a977:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p)
        ;
      }
      local_110 = &local_100;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_100 = *plVar4;
        uStack_f8 = puVar3[3];
      }
      else {
        local_100 = *plVar4;
        local_110 = (long *)*puVar3;
      }
      local_108 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
      puVar5 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar5) {
        local_a0 = *puVar5;
        lStack_98 = plVar4[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *puVar5;
        local_b0 = (ulong *)*plVar4;
      }
      local_a8 = plVar4[1];
      *plVar4 = (long)puVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      NoParen_abi_cxx11_(&local_90,this);
      uVar6 = 0xf;
      if (local_b0 != &local_a0) {
        uVar6 = local_a0;
      }
      if (uVar6 < local_90._M_string_length + local_a8) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          uVar7 = local_90.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_90._M_string_length + local_a8) goto LAB_0011aa98;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      }
      else {
LAB_0011aa98:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p)
        ;
      }
      local_f0 = &local_e0;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_e0 = *plVar4;
        uStack_d8 = puVar3[3];
      }
      else {
        local_e0 = *plVar4;
        local_f0 = (long *)*puVar3;
      }
      local_e8 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
      puVar5 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5) {
        local_d0.field_2._M_allocated_capacity = *puVar5;
        local_d0.field_2._8_8_ = plVar4[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar5;
        local_d0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_d0._M_string_length = plVar4[1];
      *plVar4 = (long)puVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      _Var8._M_p = (pointer)local_50;
      if (local_50 == &local_40) {
        return __return_storage_ptr__;
      }
      goto LAB_0011ac25;
    }
    NoParen_abi_cxx11_(&local_d0,this);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
  local_40._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
  _Var8._M_p = local_d0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
    return __return_storage_ptr__;
  }
LAB_0011ac25:
  operator_delete(_Var8._M_p,local_40._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputForcedType(
	VARTYPE VarType		/**< Variable type */
)
{
	int ThisType = GetNodeVarType();	// Var type of this node
	int NeedForce = 0;			// Do we need to force the type
	std::string result;

	//
	// A NULL will match anything
	//
	if (Type == BAS_N_NULL)
	{
		result = NoParen();
		return result;
//		return 0;
	}

	//
	// Determine if we really need to force
	//
	switch(VarType)
	{
	case VARTYPE_INTEGER:
		//
		// Integer type allows for BYTE, INTEGER, LONG
		//
		if ((ThisType != VARTYPE_BYTE) &&
			(ThisType != VARTYPE_WORD) &&
			(ThisType != VARTYPE_INTEGER) &&
			(ThisType != VARTYPE_LONG))
		{
			NeedForce = 1;
		}
		break;

	default:
		if (ThisType != VarType)
		{
			NeedForce = 1;
		}
	}

	//
	// Now force out the proper code
	//
	if (NeedForce)
	{
		result = std::string("(") + OutputVarType(VarType) + ")(" +
			NoParen() + ")";
	}
	else
	{
		result = NoParen();
	}

	return result;
}